

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.hpp
# Opt level: O2

void __thiscall OpenMD::OpenMDBitSet::OpenMDBitSet(OpenMDBitSet *this,size_t nbits)

{
  allocator_type local_11;
  
  std::vector<bool,_std::allocator<bool>_>::vector(&this->bitset_,nbits,&local_11);
  clearAll(this);
  return;
}

Assistant:

OpenMDBitSet(size_t nbits) : bitset_(nbits) { clearAll(); }